

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall FlatSigningProvider::GetKey(FlatSigningProvider *this,CKeyID *keyid,CKey *key)

{
  long lVar1;
  bool bVar2;
  CKey *in_RDX;
  CKeyID *in_RSI;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LookupHelper<std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>,CKeyID,CKey>
                    (in_RDI,in_RSI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetKey(const CKeyID& keyid, CKey& key) const { return LookupHelper(keys, keyid, key); }